

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<char_const*const&>::operator>
          (result *__return_storage_ptr__,expression_lhs<char_const*const&> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  lest *this_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  allocator local_41;
  string local_40 [32];
  
  bVar1 = std::operator>((char *)**(undefined8 **)this,rhs);
  __return_storage_ptr__->passed = bVar1;
  this_00 = *(lest **)this;
  std::__cxx11::string::string(local_40,">",&local_41);
  to_string<char_const*,std::__cxx11::string>
            (&__return_storage_ptr__->decomposition,this_00,(char **)local_40,rhs,in_R8);
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

result operator>=( R const & rhs ) { return result{ lhs >= rhs, to_string( lhs, ">=", rhs ) }; }